

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalCreateSemaphore
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,LONG lInitialCount
                    ,LONG lMaximumCount,LPCWSTR lpName,HANDLE *phSemaphore)

{
  uint uVar1;
  size_t sVar2;
  char *__format;
  LPCWSTR pWStack_70;
  CObjectAttributes oa;
  SemaphoreImmutableData *pSemaphoreData;
  IPalObject *pobjRegisteredSemaphore;
  ISynchStateController *pssc;
  IPalObject *pobjSemaphore;
  
  pWStack_70 = (LPCWSTR)0x0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName._8_8_ = lpSemaphoreAttributes;
  pobjSemaphore._4_4_ = lInitialCount;
  if (lpName != (LPCWSTR)0x0) {
    sVar2 = PAL_wcslen(lpName);
    oa.sObjectName.m_pwsz = (WCHAR *)CONCAT44((int)sVar2 + 1,(int)sVar2);
    pWStack_70 = lpName;
  }
  pssc = (ISynchStateController *)0x0;
  pSemaphoreData = (SemaphoreImmutableData *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x117);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (phSemaphore == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x118);
    fprintf(_stderr,"Expression: NULL != phSemaphore\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00343014;
  if (lpName == (LPCWSTR)0x0) {
    uVar1 = 0x57;
    if (pobjSemaphore._4_4_ <= (uint)lMaximumCount && 0 < lMaximumCount) {
      uVar1 = (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,&otSemaphore,&pWStack_70,&pssc);
      if (uVar1 == 0) {
        uVar1 = (*pssc->_vptr_ISynchStateController[2])(pssc,&oa.pSecurityAttributes);
        if (uVar1 == 0) {
          (oa.pSecurityAttributes)->nLength = lMaximumCount;
          if (pobjSemaphore._4_4_ != 0) {
            uVar1 = (*pssc->_vptr_ISynchStateController[5])(pssc,pthr,&pobjRegisteredSemaphore);
            if (uVar1 == 0) {
              uVar1 = (*pobjRegisteredSemaphore->_vptr_IPalObject[1])
                                (pobjRegisteredSemaphore,(ulong)pobjSemaphore._4_4_);
              (*pobjRegisteredSemaphore->_vptr_IPalObject[6])();
            }
            if (uVar1 != 0) {
              fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                      ,0x160);
              __format = "Unable to set new semaphore state (%d)\n";
              goto LAB_00342f12;
            }
          }
          uVar1 = (**(code **)(*g_pObjectManager + 8))
                            (g_pObjectManager,pthr,pssc,&aotSempahore,0,phSemaphore,&pSemaphoreData)
          ;
          pssc = (ISynchStateController *)0x0;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x149);
          __format = "Error %d obtaining object data\n";
LAB_00342f12:
          fprintf(_stderr,__format,(ulong)uVar1);
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x126);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    uVar1 = 0x32;
  }
  if (pssc != (ISynchStateController *)0x0) {
    (*pssc->_vptr_ISynchStateController[8])(pssc,pthr);
  }
  if (pSemaphoreData != (SemaphoreImmutableData *)0x0) {
    (**(code **)(*(long *)pSemaphoreData + 0x40))(pSemaphoreData,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_00343014:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateSemaphore(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,
    LONG lInitialCount,
    LONG lMaximumCount,
    LPCWSTR lpName,
    HANDLE *phSemaphore
    )
{
    CObjectAttributes oa(lpName, lpSemaphoreAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSemaphore = NULL;
    IPalObject *pobjRegisteredSemaphore = NULL;
    SemaphoreImmutableData *pSemaphoreData;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phSemaphore);

    ENTRY("InternalCreateSemaphore(pthr=%p, lpSemaphoreAttributes=%p, "
        "lInitialCount=%d, lMaximumCount=%d, lpName=%p, phSemaphore=%p)\n",
        pthr,
        lpSemaphoreAttributes,
        lInitialCount,
        lMaximumCount,
        lpName,
        phSemaphore
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateSemaphoreExit;
    }

    if (lMaximumCount <= 0)
    {
        ERROR("lMaximumCount is invalid (%d)\n", lMaximumCount);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateSemaphoreExit;
    }

    if ((lInitialCount < 0) || (lInitialCount > lMaximumCount))
    {
        ERROR("lInitialCount is invalid (%d)\n", lInitialCount);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateSemaphoreExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        &otSemaphore,
        &oa,
        &pobjSemaphore
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateSemaphoreExit;
    }

    palError = pobjSemaphore->GetImmutableData(reinterpret_cast<void**>(&pSemaphoreData));

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining object data\n", palError);
        goto InternalCreateSemaphoreExit;
    }

    pSemaphoreData->lMaximumCount = lMaximumCount;

    if (0 != lInitialCount)
    {
        ISynchStateController *pssc;

        palError = pobjSemaphore->GetSynchStateController(
            pthr,
            &pssc
            );

        if (NO_ERROR == palError)
        {
            palError = pssc->SetSignalCount(lInitialCount);
            pssc->ReleaseController();
        }

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to set new semaphore state (%d)\n", palError);
            goto InternalCreateSemaphoreExit;
        }
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjSemaphore,
        &aotSempahore,
        0, // Should be SEMAPHORE_ALL_ACCESS; currently ignored (no Win32 security)
        phSemaphore,
        &pobjRegisteredSemaphore
        );

    //
    // pobjSemaphore is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pobjSemaphore = NULL;

InternalCreateSemaphoreExit:

    if (NULL != pobjSemaphore)
    {
        pobjSemaphore->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredSemaphore)
    {
        pobjRegisteredSemaphore->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateSemaphore returns %d\n", palError);

    return palError;
}